

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O3

void ggml_compute_forward_abs(ggml_compute_params *params,ggml_tensor *dst)

{
  uint *puVar1;
  ggml_type gVar2;
  ggml_type gVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  void *pvVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  char cVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  char *pcVar38;
  long lVar39;
  int64_t nth;
  ushort uVar40;
  undefined8 uVar41;
  uint uVar42;
  int64_t ir;
  long lVar43;
  long lVar44;
  ggml_tensor *src0;
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar45 [32];
  
  pgVar6 = dst->src[0];
  gVar2 = dst->type;
  gVar3 = pgVar6->type;
  if (gVar3 == GGML_TYPE_BF16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] == 4) {
          if (pgVar6->nb[0] == 2) {
            sVar7 = pgVar6->nb[2];
            sVar8 = pgVar6->nb[3];
            sVar9 = pgVar6->nb[1];
            lVar10 = pgVar6->ne[1];
            lVar44 = pgVar6->ne[2];
            lVar11 = dst->ne[0];
            sVar12 = dst->nb[1];
            sVar13 = dst->nb[2];
            sVar14 = dst->nb[3];
            iVar4 = params->ith;
            iVar5 = params->nth;
            lVar33 = ggml_nrows(pgVar6);
            lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
            lVar43 = iVar4 * lVar34;
            lVar34 = lVar34 + lVar43;
            if (lVar33 <= lVar34) {
              lVar34 = lVar33;
            }
            if (lVar43 < lVar34) {
              auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar49 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
              pvVar15 = pgVar6->data;
              lVar44 = lVar44 * lVar10;
              pvVar16 = dst->data;
              auVar50 = vpbroadcastq_avx512f();
              do {
                lVar33 = lVar43 / lVar44;
                lVar39 = lVar43 % lVar44;
                lVar35 = lVar39 / lVar10;
                lVar39 = lVar39 % lVar10;
                if (0 < lVar11) {
                  uVar37 = 0;
                  do {
                    auVar51 = vpbroadcastq_avx512f();
                    auVar52 = vporq_avx512f(auVar51,auVar47);
                    auVar51 = vporq_avx512f(auVar51,auVar48);
                    uVar41 = vpcmpuq_avx512f(auVar51,auVar50,2);
                    bVar30 = (byte)uVar41;
                    uVar41 = vpcmpuq_avx512f(auVar52,auVar50,2);
                    bVar31 = (byte)uVar41;
                    uVar40 = CONCAT11(bVar31,bVar30);
                    auVar45 = vmovdqu16_avx512vl(*(undefined1 (*) [32])
                                                  ((long)pvVar15 +
                                                  uVar37 * 2 +
                                                  lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8))
                    ;
                    auVar46._2_2_ = (ushort)((byte)(uVar40 >> 1) & 1) * auVar45._2_2_;
                    auVar46._0_2_ = (ushort)(bVar30 & 1) * auVar45._0_2_;
                    auVar46._4_2_ = (ushort)((byte)(uVar40 >> 2) & 1) * auVar45._4_2_;
                    auVar46._6_2_ = (ushort)((byte)(uVar40 >> 3) & 1) * auVar45._6_2_;
                    auVar46._8_2_ = (ushort)((byte)(uVar40 >> 4) & 1) * auVar45._8_2_;
                    auVar46._10_2_ = (ushort)((byte)(uVar40 >> 5) & 1) * auVar45._10_2_;
                    auVar46._12_2_ = (ushort)((byte)(uVar40 >> 6) & 1) * auVar45._12_2_;
                    auVar46._14_2_ = (ushort)((byte)(uVar40 >> 7) & 1) * auVar45._14_2_;
                    auVar46._16_2_ = (ushort)(bVar31 & 1) * auVar45._16_2_;
                    auVar46._18_2_ = (ushort)(bVar31 >> 1 & 1) * auVar45._18_2_;
                    auVar46._20_2_ = (ushort)(bVar31 >> 2 & 1) * auVar45._20_2_;
                    auVar46._22_2_ = (ushort)(bVar31 >> 3 & 1) * auVar45._22_2_;
                    auVar46._24_2_ = (ushort)(bVar31 >> 4 & 1) * auVar45._24_2_;
                    auVar46._26_2_ = (ushort)(bVar31 >> 5 & 1) * auVar45._26_2_;
                    auVar46._28_2_ = (ushort)(bVar31 >> 6 & 1) * auVar45._28_2_;
                    auVar46._30_2_ = (ushort)(bVar31 >> 7) * auVar45._30_2_;
                    auVar51 = vpmovzxwd_avx512f(auVar46);
                    auVar51 = vpslld_avx512f(auVar51,0x10);
                    auVar51 = vpandd_avx512f(auVar51,auVar49);
                    puVar1 = (uint *)((long)pvVar16 +
                                     uVar37 * 4 +
                                     lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14);
                    bVar17 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar18 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar19 = (bool)((byte)(uVar40 >> 3) & 1);
                    bVar20 = (bool)((byte)(uVar40 >> 4) & 1);
                    bVar21 = (bool)((byte)(uVar40 >> 5) & 1);
                    bVar22 = (bool)((byte)(uVar40 >> 6) & 1);
                    bVar23 = (bool)((byte)(uVar40 >> 7) & 1);
                    bVar24 = (bool)(bVar31 >> 1 & 1);
                    bVar25 = (bool)(bVar31 >> 2 & 1);
                    bVar26 = (bool)(bVar31 >> 3 & 1);
                    bVar27 = (bool)(bVar31 >> 4 & 1);
                    bVar28 = (bool)(bVar31 >> 5 & 1);
                    bVar29 = (bool)(bVar31 >> 6 & 1);
                    *puVar1 = (uint)(bVar30 & 1) * auVar51._0_4_ |
                              (uint)!(bool)(bVar30 & 1) * *puVar1;
                    puVar1[1] = (uint)bVar17 * auVar51._4_4_ | (uint)!bVar17 * puVar1[1];
                    puVar1[2] = (uint)bVar18 * auVar51._8_4_ | (uint)!bVar18 * puVar1[2];
                    puVar1[3] = (uint)bVar19 * auVar51._12_4_ | (uint)!bVar19 * puVar1[3];
                    puVar1[4] = (uint)bVar20 * auVar51._16_4_ | (uint)!bVar20 * puVar1[4];
                    puVar1[5] = (uint)bVar21 * auVar51._20_4_ | (uint)!bVar21 * puVar1[5];
                    puVar1[6] = (uint)bVar22 * auVar51._24_4_ | (uint)!bVar22 * puVar1[6];
                    puVar1[7] = (uint)bVar23 * auVar51._28_4_ | (uint)!bVar23 * puVar1[7];
                    puVar1[8] = (uint)(bVar31 & 1) * auVar51._32_4_ |
                                (uint)!(bool)(bVar31 & 1) * puVar1[8];
                    puVar1[9] = (uint)bVar24 * auVar51._36_4_ | (uint)!bVar24 * puVar1[9];
                    puVar1[10] = (uint)bVar25 * auVar51._40_4_ | (uint)!bVar25 * puVar1[10];
                    puVar1[0xb] = (uint)bVar26 * auVar51._44_4_ | (uint)!bVar26 * puVar1[0xb];
                    puVar1[0xc] = (uint)bVar27 * auVar51._48_4_ | (uint)!bVar27 * puVar1[0xc];
                    puVar1[0xd] = (uint)bVar28 * auVar51._52_4_ | (uint)!bVar28 * puVar1[0xd];
                    puVar1[0xe] = (uint)bVar29 * auVar51._56_4_ | (uint)!bVar29 * puVar1[0xe];
                    puVar1[0xf] = (uint)(bVar31 >> 7) * auVar51._60_4_ |
                                  (uint)!(bool)(bVar31 >> 7) * puVar1[0xf];
                    uVar37 = uVar37 + 0x10;
                  } while ((lVar11 + 0xfU & 0xfffffffffffffff0) != uVar37);
                }
                lVar43 = lVar43 + 1;
              } while (lVar43 != lVar34);
            }
            return;
          }
          goto LAB_00128bad;
        }
        goto LAB_00128b91;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_BF16) goto LAB_00128b89;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128b91;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[1];
          sVar13 = dst->nb[2];
          sVar14 = dst->nb[3];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          pvVar15 = pgVar6->data;
          lVar44 = lVar44 * lVar10;
          pvVar16 = dst->data;
          do {
            lVar33 = lVar43 / lVar44;
            lVar39 = lVar43 % lVar44;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                uVar40 = *(ushort *)
                          ((long)pvVar15 +
                          lVar36 * 2 + lVar35 * sVar7 + lVar39 * sVar9 + lVar33 * sVar8);
                uVar42 = (uVar40 & 0x7fff) * 0x10000;
                if (uVar42 < 0x7f800001) {
                  uVar40 = (ushort)(uVar42 + 0x7fff + (uVar40 & 1) >> 0x10);
                }
                else {
                  uVar40 = uVar40 & 0x7fff | 0x40;
                }
                *(ushort *)
                 ((long)pvVar16 + lVar36 * 2 + lVar35 * sVar13 + lVar39 * sVar12 + lVar33 * sVar14)
                     = uVar40;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
        goto LAB_00128bad;
      }
    }
  }
  else if (gVar3 == GGML_TYPE_F16) {
    if (gVar2 == GGML_TYPE_F32) {
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_00128b91;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          sVar12 = dst->nb[3];
          sVar13 = dst->nb[1];
          sVar14 = dst->nb[2];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          auVar55._8_4_ = 0x7fffffff;
          auVar55._0_8_ = 0x7fffffff7fffffff;
          auVar55._12_4_ = 0x7fffffff;
          lVar44 = lVar44 * lVar10;
          pvVar15 = dst->data;
          pvVar16 = pgVar6->data;
          do {
            lVar33 = lVar43 / lVar44;
            lVar39 = lVar43 % lVar44;
            lVar35 = lVar39 / lVar10;
            lVar39 = lVar39 % lVar10;
            if (0 < lVar11) {
              lVar36 = 0;
              do {
                auVar54 = vpand_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                     (ulong)*(ushort *)
                                                             ((long)pvVar16 +
                                                             lVar36 * 2 +
                                                             lVar35 * sVar7 +
                                                             lVar39 * sVar9 + lVar33 * sVar8) * 4)),
                                    auVar55);
                *(int *)((long)pvVar15 +
                        lVar36 * 4 + lVar35 * sVar14 + lVar39 * sVar13 + lVar33 * sVar12) =
                     auVar54._0_4_;
                lVar36 = lVar36 + 1;
              } while (lVar11 != lVar36);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
LAB_00128bad:
        pcVar38 = "nb00 == sizeof(src0_t)";
        uVar41 = 0x56;
        goto LAB_00128bc7;
      }
    }
    else {
      if (gVar2 != GGML_TYPE_F16) goto LAB_00128b89;
      cVar32 = ggml_is_contiguous_1(pgVar6);
      if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
         (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00128b91;
        if (pgVar6->nb[0] == 2) {
          sVar7 = pgVar6->nb[2];
          sVar8 = pgVar6->nb[3];
          sVar9 = pgVar6->nb[1];
          lVar10 = pgVar6->ne[1];
          lVar44 = pgVar6->ne[2];
          lVar11 = dst->ne[0];
          iVar4 = params->ith;
          iVar5 = params->nth;
          lVar33 = ggml_nrows(pgVar6);
          lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
          lVar43 = iVar4 * lVar34;
          lVar34 = lVar34 + lVar43;
          if (lVar33 <= lVar34) {
            lVar34 = lVar33;
          }
          if (lVar34 <= lVar43) {
            return;
          }
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          lVar44 = lVar44 * lVar10;
          do {
            lVar33 = lVar43 % lVar44;
            if (0 < lVar11) {
              lVar35 = 0;
              do {
                auVar55 = vpand_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                     (ulong)*(ushort *)
                                                             ((long)pgVar6->data +
                                                             lVar35 * 2 +
                                                             (lVar33 / lVar10) * sVar7 +
                                                             (lVar33 % lVar10) * sVar9 +
                                                             (lVar43 / lVar44) * sVar8) * 4)),
                                    auVar54);
                auVar55 = vcvtps2ph_f16c(auVar55,0);
                vpextrw_avx(auVar55,0);
                lVar35 = lVar35 + 1;
              } while (lVar11 != lVar35);
            }
            lVar43 = lVar43 + 1;
          } while (lVar43 != lVar34);
          return;
        }
        goto LAB_00128bad;
      }
    }
  }
  else {
    if ((gVar3 != GGML_TYPE_F32) || (gVar2 != GGML_TYPE_F32)) {
LAB_00128b89:
      ggml_compute_forward_abs_cold_1();
LAB_00128b91:
      pcVar38 = "nb0 == sizeof(dst_t)";
      uVar41 = 0x55;
      goto LAB_00128bc7;
    }
    cVar32 = ggml_is_contiguous_1(pgVar6);
    if (((cVar32 != '\0') && (cVar32 = ggml_is_contiguous_1(dst), cVar32 != '\0')) &&
       (cVar32 = ggml_are_same_shape(pgVar6,dst), cVar32 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_00128b91;
      if (pgVar6->nb[0] == 4) {
        sVar7 = pgVar6->nb[2];
        sVar8 = pgVar6->nb[1];
        sVar9 = pgVar6->nb[3];
        lVar10 = pgVar6->ne[1];
        lVar44 = pgVar6->ne[2];
        lVar11 = dst->ne[0];
        sVar12 = dst->nb[2];
        sVar13 = dst->nb[3];
        sVar14 = dst->nb[1];
        iVar4 = params->ith;
        iVar5 = params->nth;
        lVar33 = ggml_nrows(pgVar6);
        lVar34 = ((long)iVar5 + -1 + lVar33) / (long)iVar5;
        lVar43 = iVar4 * lVar34;
        lVar34 = lVar34 + lVar43;
        if (lVar33 <= lVar34) {
          lVar34 = lVar33;
        }
        if (lVar34 <= lVar43) {
          return;
        }
        auVar53._8_4_ = 0x7fffffff;
        auVar53._0_8_ = 0x7fffffff7fffffff;
        auVar53._12_4_ = 0x7fffffff;
        lVar44 = lVar44 * lVar10;
        pvVar15 = dst->data;
        pvVar16 = pgVar6->data;
        do {
          lVar33 = lVar43 / lVar44;
          lVar39 = lVar43 % lVar44;
          lVar35 = lVar39 / lVar10;
          lVar39 = lVar39 % lVar10;
          if (0 < lVar11) {
            lVar36 = 0;
            do {
              auVar55 = vpand_avx(ZEXT416(*(uint *)((long)pvVar16 +
                                                   lVar36 * 4 +
                                                   lVar35 * sVar7 + lVar39 * sVar8 + lVar33 * sVar9)
                                         ),auVar53);
              *(int *)((long)pvVar15 +
                      lVar36 * 4 + lVar35 * sVar12 + lVar39 * sVar14 + lVar33 * sVar13) =
                   auVar55._0_4_;
              lVar36 = lVar36 + 1;
            } while (lVar11 != lVar36);
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != lVar34);
        return;
      }
      goto LAB_00128bad;
    }
  }
  pcVar38 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uVar41 = 0x51;
LAB_00128bc7:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uVar41,"GGML_ASSERT(%s) failed",pcVar38);
}

Assistant:

void ggml_compute_forward_abs(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_abs>(params, dst);
}